

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicHandleInfo.hpp
# Opt level: O0

void __thiscall
helics::BasicHandleInfo::BasicHandleInfo
          (BasicHandleInfo *this,GlobalFederateId federate_id,InterfaceHandle handle_id,
          InterfaceType type_of_handle,string_view key_name,string_view type_name,
          string_view unit_name)

{
  undefined1 in_CL;
  InterfaceHandle in_EDX;
  GlobalFederateId in_ESI;
  GlobalHandle *in_RDI;
  GlobalHandle *__a;
  basic_string_view<char,_std::char_traits<char>_> *__t;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  basic_string_view<char,_std::char_traits<char>_> local_2d [2];
  
  local_2d[0]._M_str._4_1_ = in_CL;
  GlobalHandle::GlobalHandle(in_RDI,in_ESI,in_EDX);
  in_RDI[1].fed_id.gid = 0;
  LocalFederateId::LocalFederateId((LocalFederateId *)(in_RDI + 1));
  *(undefined1 *)&in_RDI[1].handle.hid = local_2d[0]._M_str._4_1_;
  *(undefined1 *)((long)&in_RDI[1].handle.hid + 1) = 0;
  *(undefined2 *)((long)&in_RDI[1].handle.hid + 2) = 0;
  __a = in_RDI + 2;
  __t = local_2d;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_stack_ffffffffffffffc0,__t,(allocator<char> *)__a);
  std::allocator<char>::~allocator((allocator<char> *)local_2d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_stack_ffffffffffffffc0,__t,(allocator<char> *)__a);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffc3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_stack_ffffffffffffffc0,__t,(allocator<char> *)__a);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffc2);
  in_RDI[0xe] = (GlobalHandle)(in_RDI + 6);
  in_RDI[0xf] = (GlobalHandle)(in_RDI + 10);
  CLI::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)0x5977f6);
  return;
}

Assistant:

BasicHandleInfo(GlobalFederateId federate_id,
                    InterfaceHandle handle_id,
                    InterfaceType type_of_handle,
                    std::string_view key_name,
                    std::string_view type_name,
                    std::string_view unit_name):
        handle{federate_id, handle_id}, handleType(type_of_handle), key(key_name), type(type_name),
        units(unit_name), type_in(type), type_out(units)

    {
    }